

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

uint32_t __thiscall r_comp::Compiler::add_hlp_reference(Compiler *this,string *reference_name)

{
  __type _Var1;
  size_type sVar2;
  reference __rhs;
  uint local_24;
  uint32_t i;
  string *reference_name_local;
  Compiler *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->hlp_references);
    if (sVar2 <= local_24) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->hlp_references,reference_name);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->hlp_references);
      return (int)sVar2 - 1;
    }
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->hlp_references,(ulong)local_24);
    _Var1 = std::operator==(reference_name,__rhs);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

uint32_t Compiler::add_hlp_reference(std::string reference_name)
{
    for (uint32_t i = 0; i < hlp_references.size(); ++i)
        if (reference_name == hlp_references[i]) {
            return i;
        }

    hlp_references.push_back(reference_name);
    return hlp_references.size() - 1;
}